

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

buffer_appender<char> __thiscall
fmt::v7::detail::fallback_formatter<std::_Put_time<char>,char,void>::
format<fmt::v7::detail::buffer_appender<char>>
          (fallback_formatter<std::_Put_time<char>,char,void> *this,_Put_time<char> *value,
          basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  char *s;
  size_t count;
  iterator iVar1;
  undefined1 local_270 [8];
  basic_string_view<char> str;
  allocator<char> local_241;
  undefined1 local_240 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx_local;
  _Put_time<char> *value_local;
  fallback_formatter<std::_Put_time<char>,_char,_void> *this_local;
  
  buffer._528_8_ = ctx;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240,&local_241);
  std::allocator<char>::~allocator(&local_241);
  str.size_ = (size_t)basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::locale
                                ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>
                                  *)buffer._528_8_);
  format_value<char,std::_Put_time<char>>((buffer<char> *)local_240,value,(locale_ref)str.size_);
  s = buffer<char>::data((buffer<char> *)local_240);
  count = buffer<char>::size((buffer<char> *)local_240);
  basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_270,s,count);
  iVar1 = formatter<fmt::v7::basic_string_view<char>,char,void>::
          format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                    ((formatter<fmt::v7::basic_string_view<char>,char,void> *)this,
                     (basic_string_view<char> *)local_270,
                     (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                     buffer._528_8_);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240);
  return (buffer_appender<char>)
         iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

auto format(const T& value, basic_format_context<OutputIt, Char>& ctx)
      -> OutputIt {
    basic_memory_buffer<Char> buffer;
    format_value(buffer, value, ctx.locale());
    basic_string_view<Char> str(buffer.data(), buffer.size());
    return formatter<basic_string_view<Char>, Char>::format(str, ctx);
  }